

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kpagent.c
# Opt level: O1

kp_error_t kp_agent_store(kp_agent *agent,kp_unsafe *unsafe)

{
  storage sVar1;
  kp_agent_safe *pkVar2;
  uint uVar3;
  kp_agent_safe *__s1;
  char *pcVar4;
  ulong uVar5;
  kp_store *pkVar6;
  int *piVar7;
  kp_store *pkVar8;
  kp_store *pkVar9;
  kp_store *pkVar10;
  kp_store *pkVar11;
  kp_error_t kVar12;
  storage *psVar13;
  
  __s1 = (kp_agent_safe *)malloc(0x1010);
  if (__s1 == (kp_agent_safe *)0x0) {
    piVar7 = __errno_location();
    *piVar7 = 0xc;
    kVar12 = 5;
  }
  else {
    pcVar4 = (char *)sodium_malloc(0x1000);
    __s1->password = pcVar4;
    pcVar4 = (char *)sodium_malloc(0x1000);
    __s1->metadata = pcVar4;
    uVar5 = strlcpy(__s1,unsafe->name,0x1000);
    if ((((uVar5 < 0x1000) &&
         (uVar5 = strlcpy(__s1->password,unsafe->password,0x1000), uVar5 < 0x1000)) &&
        (uVar5 = strlcpy(__s1->metadata,unsafe->metadata,0x1000), uVar5 < 0x1000)) &&
       (pkVar6 = (kp_store *)malloc(0x28), pkVar6 != (kp_store *)0x0)) {
      pkVar6->safe = __s1;
      sVar1 = storage;
      if (storage.rbh_root == (kp_store *)0x0) {
        uVar5 = 8;
        pkVar11 = (kp_store *)0x0;
      }
      else {
        do {
          pkVar11 = sVar1.rbh_root;
          uVar3 = strncmp((char *)__s1,pkVar11->safe->name,0x1000);
          pkVar8 = pkVar11;
          if (-1 < (int)uVar3) {
            if (uVar3 == 0) goto LAB_00105318;
            pkVar8 = (kp_store *)&(pkVar11->tree).rbe_right;
          }
          sVar1.rbh_root = (pkVar8->tree).rbe_left;
        } while (sVar1.rbh_root != (kp_store *)0x0);
        uVar5 = (ulong)(~uVar3 >> 0x1c & 0xfffffff8);
      }
      (pkVar6->tree).rbe_parent = pkVar11;
      (pkVar6->tree).rbe_left = (kp_store *)0x0;
      (pkVar6->tree).rbe_right = (kp_store *)0x0;
      (pkVar6->tree).rbe_color = 1;
      sVar1.rbh_root = pkVar6;
      if (pkVar11 != (kp_store *)0x0) {
        *(kp_store **)((long)&(pkVar11->tree).rbe_left + uVar5) = pkVar6;
        do {
          sVar1.rbh_root = storage.rbh_root;
          if ((pkVar11->tree).rbe_color != 1) break;
          pkVar8 = (pkVar11->tree).rbe_parent;
          pkVar9 = (pkVar8->tree).rbe_left;
          if (pkVar11 == pkVar9) {
            pkVar9 = (pkVar8->tree).rbe_right;
            if ((pkVar9 != (kp_store *)0x0) && ((pkVar9->tree).rbe_color == 1)) goto LAB_001051a2;
            pkVar9 = (pkVar11->tree).rbe_right;
            pkVar10 = pkVar11;
            if (pkVar9 == pkVar6) {
              pkVar10 = (pkVar9->tree).rbe_left;
              (pkVar11->tree).rbe_right = pkVar10;
              if (pkVar10 != (kp_store *)0x0) {
                (pkVar10->tree).rbe_parent = pkVar11;
              }
              pkVar10 = (pkVar11->tree).rbe_parent;
              (pkVar9->tree).rbe_parent = pkVar10;
              psVar13 = &storage;
              if (pkVar10 != (kp_store *)0x0) {
                pkVar10 = (pkVar11->tree).rbe_parent;
                psVar13 = (storage *)
                          (&(pkVar10->tree).rbe_left + (pkVar11 != (pkVar10->tree).rbe_left));
              }
              *psVar13 = (storage)pkVar9;
              (pkVar9->tree).rbe_left = pkVar11;
              (pkVar11->tree).rbe_parent = pkVar9;
              pkVar10 = pkVar6;
              pkVar6 = pkVar11;
            }
            (pkVar10->tree).rbe_color = 0;
            (pkVar8->tree).rbe_color = 1;
            pkVar11 = (pkVar8->tree).rbe_left;
            pkVar9 = (pkVar11->tree).rbe_right;
            (pkVar8->tree).rbe_left = pkVar9;
            if (pkVar9 != (kp_store *)0x0) {
              (pkVar9->tree).rbe_parent = pkVar8;
            }
            pkVar9 = (pkVar8->tree).rbe_parent;
            (pkVar11->tree).rbe_parent = pkVar9;
            psVar13 = &storage;
            if (pkVar9 != (kp_store *)0x0) {
              pkVar9 = (pkVar8->tree).rbe_parent;
              psVar13 = (storage *)(&(pkVar9->tree).rbe_left + (pkVar8 != (pkVar9->tree).rbe_left));
            }
            *psVar13 = (storage)pkVar11;
            (pkVar11->tree).rbe_right = pkVar8;
LAB_001052e4:
            (pkVar8->tree).rbe_parent = pkVar11;
          }
          else {
            if ((pkVar9 == (kp_store *)0x0) || ((pkVar9->tree).rbe_color != 1)) {
              pkVar9 = (pkVar11->tree).rbe_left;
              pkVar10 = pkVar11;
              if (pkVar9 == pkVar6) {
                pkVar10 = (pkVar9->tree).rbe_right;
                (pkVar11->tree).rbe_left = pkVar10;
                if (pkVar10 != (kp_store *)0x0) {
                  (pkVar10->tree).rbe_parent = pkVar11;
                }
                pkVar10 = (pkVar11->tree).rbe_parent;
                (pkVar9->tree).rbe_parent = pkVar10;
                psVar13 = &storage;
                if (pkVar10 != (kp_store *)0x0) {
                  pkVar10 = (pkVar11->tree).rbe_parent;
                  psVar13 = (storage *)
                            (&(pkVar10->tree).rbe_left + (pkVar11 != (pkVar10->tree).rbe_left));
                }
                *psVar13 = (storage)pkVar9;
                (pkVar9->tree).rbe_right = pkVar11;
                (pkVar11->tree).rbe_parent = pkVar9;
                pkVar10 = pkVar6;
                pkVar6 = pkVar11;
              }
              (pkVar10->tree).rbe_color = 0;
              (pkVar8->tree).rbe_color = 1;
              pkVar11 = (pkVar8->tree).rbe_right;
              pkVar9 = (pkVar11->tree).rbe_left;
              (pkVar8->tree).rbe_right = pkVar9;
              if (pkVar9 != (kp_store *)0x0) {
                (pkVar9->tree).rbe_parent = pkVar8;
              }
              pkVar9 = (pkVar8->tree).rbe_parent;
              (pkVar11->tree).rbe_parent = pkVar9;
              psVar13 = &storage;
              if (pkVar9 != (kp_store *)0x0) {
                pkVar9 = (pkVar8->tree).rbe_parent;
                psVar13 = (storage *)
                          (&(pkVar9->tree).rbe_left + (pkVar8 != (pkVar9->tree).rbe_left));
              }
              *psVar13 = (storage)pkVar11;
              (pkVar11->tree).rbe_left = pkVar8;
              goto LAB_001052e4;
            }
LAB_001051a2:
            (pkVar9->tree).rbe_color = 0;
            (pkVar11->tree).rbe_color = 0;
            (pkVar8->tree).rbe_color = 1;
            pkVar6 = pkVar8;
          }
          pkVar11 = (pkVar6->tree).rbe_parent;
          sVar1.rbh_root = storage.rbh_root;
        } while (pkVar11 != (kp_store *)0x0);
      }
      storage.rbh_root = sVar1.rbh_root;
      ((storage.rbh_root)->tree).rbe_color = 0;
      pkVar11 = (kp_store *)0x0;
LAB_00105318:
      kVar12 = 0;
      if (pkVar11 != (kp_store *)0x0) {
        pkVar2 = pkVar11->safe;
        sodium_free(pkVar2->password);
        sodium_free(pkVar2->metadata);
        pkVar11->safe = __s1;
      }
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0xc;
      kVar12 = 5;
    }
  }
  return kVar12;
}

Assistant:

kp_error_t
kp_agent_store(struct kp_agent *agent, struct kp_unsafe *unsafe)
{
	kp_error_t ret;
	struct kp_store *store, *existing;
	struct kp_agent_safe *safe;

	if ((ret = kp_agent_safe_create(agent, &safe)) != KP_SUCCESS) {
		return ret;
	}

	if (strlcpy(safe->name, unsafe->name, PATH_MAX) >= PATH_MAX) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->password, unsafe->password, KP_PASSWORD_MAX_LEN)
	    >= KP_PASSWORD_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->metadata, unsafe->metadata, KP_METADATA_MAX_LEN)
	    >= KP_METADATA_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	if ((store = malloc(sizeof(struct kp_store))) == NULL) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	store->safe = safe;

	existing = RB_INSERT(storage, &storage, store);
	if (existing != NULL) {
		kp_agent_safe_free(agent, existing->safe);
		existing->safe = safe;
	}

	ret = KP_SUCCESS;

out:
	return ret;
}